

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O1

base_uint<256U> * __thiscall base_uint<256U>::operator+=(base_uint<256U> *this,base_uint<256U> *b)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0;
  uVar3 = 0;
  do {
    uVar3 = (ulong)b->pn[lVar2] + this->pn[lVar2] + uVar3;
    this->pn[lVar2] = (uint32_t)uVar3;
    uVar3 = uVar3 >> 0x20;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator+=(const base_uint& b)
    {
        uint64_t carry = 0;
        for (int i = 0; i < WIDTH; i++)
        {
            uint64_t n = carry + pn[i] + b.pn[i];
            pn[i] = n & 0xffffffff;
            carry = n >> 32;
        }
        return *this;
    }